

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

int av1_svc_primary_ref_frame(AV1_COMP *cpi)

{
  uint uVar1;
  int iVar2;
  long *in_RDI;
  int flags;
  ExternalFlags *ext_flags;
  int primary_ref_frame;
  int fb_idx;
  AV1_COMMON *cm;
  SVC *svc;
  int local_20;
  
  local_20 = 7;
  if (((int)in_RDI[0x13a67] < 2) && (*(int *)((long)in_RDI + 0x9d33c) < 2)) {
    if (*(int *)(*in_RDI + 0x14dc0) != 0) {
      uVar1 = *(uint *)(in_RDI + 0x85b0);
      if ((uVar1 & 1) == 0) {
        if ((uVar1 & 8) == 0) {
          if ((uVar1 & 0x40) != 0) {
            local_20 = 6;
          }
        }
        else {
          local_20 = 3;
        }
      }
      else {
        local_20 = 0;
      }
    }
  }
  else {
    iVar2 = get_ref_frame_map_idx((AV1_COMMON *)(in_RDI + 0x77f0),'\x01');
    if (((*(int *)(*in_RDI + 0x14d68) == 1) &&
        (*(int *)((long)in_RDI + (long)iVar2 * 4 + 0x9d368) == (int)in_RDI[0x13a66])) &&
       ((*(int *)((long)in_RDI + (long)iVar2 * 4 + 0x9d388) < *(int *)((long)in_RDI + 0x9d334) ||
        (*(int *)((long)in_RDI + (long)iVar2 * 4 + 0x9d388) == 0)))) {
      local_20 = 0;
    }
  }
  return local_20;
}

Assistant:

int av1_svc_primary_ref_frame(const AV1_COMP *const cpi) {
  const SVC *const svc = &cpi->svc;
  const AV1_COMMON *const cm = &cpi->common;
  int fb_idx = -1;
  int primary_ref_frame = PRIMARY_REF_NONE;
  if (cpi->svc.number_spatial_layers > 1 ||
      cpi->svc.number_temporal_layers > 1) {
    // Set the primary_ref_frame to LAST_FRAME if that buffer slot for LAST
    // was last updated on a lower temporal layer (or base TL0) and for the
    // same spatial layer. For RTC patterns this allows for continued decoding
    // when set of enhancement layers are dropped (continued decoding starting
    // at next base TL0), so error_resilience can be off/0 for all layers.
    fb_idx = get_ref_frame_map_idx(cm, LAST_FRAME);
    if (cpi->ppi->rtc_ref.reference[0] == 1 &&
        svc->spatial_layer_fb[fb_idx] == svc->spatial_layer_id &&
        (svc->temporal_layer_fb[fb_idx] < svc->temporal_layer_id ||
         svc->temporal_layer_fb[fb_idx] == 0)) {
      primary_ref_frame = 0;  // LAST_FRAME: ref_frame - LAST_FRAME
    }
  } else if (cpi->ppi->rtc_ref.set_ref_frame_config) {
    const ExternalFlags *const ext_flags = &cpi->ext_flags;
    int flags = ext_flags->ref_frame_flags;
    if (flags & AOM_LAST_FLAG) {
      primary_ref_frame = 0;  // LAST_FRAME: ref_frame - LAST_FRAME
    } else if (flags & AOM_GOLD_FLAG) {
      primary_ref_frame = GOLDEN_FRAME - LAST_FRAME;
    } else if (flags & AOM_ALT_FLAG) {
      primary_ref_frame = ALTREF_FRAME - LAST_FRAME;
    }
  }
  return primary_ref_frame;
}